

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O1

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_char,bool>
          (BaseAppender *this,Vector *col,uchar input)

{
  bool bVar1;
  InvalidInputException *this_00;
  uchar input_00;
  bool result;
  bool local_39;
  string local_38;
  
  bVar1 = TryCast::Operation<unsigned_char,bool>(input,&local_39,false);
  if (bVar1) {
    col->data[(this->chunk).count] = local_39;
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_char,bool>(&local_38,(duckdb *)(ulong)input,input_00);
  InvalidInputException::InvalidInputException(this_00,&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}